

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits.hpp
# Opt level: O2

type * __thiscall
jsoncons::
json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
::as<std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (type *__return_storage_ptr__,
          json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
          *this,basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j)

{
  bool bVar1;
  uchar uVar2;
  semantic_tag tag;
  size_t __n;
  iterator this_00;
  conv_error *pcVar3;
  error_category *peVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *result;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *item;
  error_code ec_00;
  error_code ec_01;
  const_array_range_type cVar5;
  value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  converter;
  anon_union_16_15_54cbd7ed_for_basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_5
  local_40;
  error_code ec;
  
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
  if (bVar1) {
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __n = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                    ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(__return_storage_ptr__,__n);
    cVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::array_range
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
    for (this_00 = cVar5.first_._M_current; this_00._M_current != cVar5.last_._M_current._M_current;
        this_00._M_current = this_00._M_current + 1) {
      uVar2 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
              as_integer<unsigned_char>(this_00._M_current);
      local_40._0_1_ = uVar2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (__return_storage_ptr__,(uchar *)&local_40);
    }
  }
  else {
    bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_byte_string
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
    if (bVar1) {
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_byte_string_view
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                 &local_40.common_);
      basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::tag
                ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
                 (uchar *)local_40._0_8_,
                 &((local_40.long_str_.ptr_)->
                  super_heap_string_base<jsoncons::null_type,_std::allocator<char>_>).field_0x0 +
                 local_40._0_8_,(allocator_type *)&converter);
    }
    else {
      bVar1 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                        ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
      if (!bVar1) {
        pcVar3 = (conv_error *)__cxa_allocate_exception(0x58);
        peVar4 = conv_error_category();
        ec_01._M_cat = peVar4;
        ec_01._0_8_ = 4;
        conv_error::conv_error(pcVar3,ec_01);
        __cxa_throw(pcVar3,&conv_error::typeinfo,conv_error::~conv_error);
      }
      local_40.int64_ =
           (int64_storage)
           basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view
                     ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
      tag = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::tag
                      ((basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *)this);
      value_converter<std::basic_string_view<char,_std::char_traits<char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::convert<char>(__return_storage_ptr__,&converter,
                      (basic_string_view<char,_std::char_traits<char>_> *)&local_40.common_,tag,&ec)
      ;
      if (ec._M_value != 0) {
        pcVar3 = (conv_error *)__cxa_allocate_exception(0x58);
        ec_00._4_4_ = 0;
        ec_00._M_value = ec._M_value;
        ec_00._M_cat = ec._M_cat;
        conv_error::conv_error(pcVar3,ec_00);
        __cxa_throw(pcVar3,&conv_error::typeinfo,conv_error::~conv_error);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static typename std::enable_if<ext_traits::is_byte<typename Container::value_type>::value,Container>::type
        as(const Json& j)
        {
            std::error_code ec;
            if (j.is_array())
            {
                T result;
                visit_reserve_(typename std::integral_constant<bool, ext_traits::has_reserve<T>::value>::type(),result,j.size());
                for (const auto& item : j.array_range())
                {
                    result.push_back(item.template as<value_type>());
                }

                return result;
            }
            else if (j.is_byte_string_view())
            {
                value_converter<byte_string_view,T> converter;
                auto v = converter.convert(j.as_byte_string_view(),j.tag(), ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    JSONCONS_THROW(conv_error(ec));
                }
                return v;
            }
            else if (j.is_string())
            {
                value_converter<basic_string_view<char>,T> converter;
                auto v = converter.convert(j.as_string_view(),j.tag(), ec);
                if (JSONCONS_UNLIKELY(ec))
                {
                    JSONCONS_THROW(conv_error(ec));
                }
                return v;
            }
            else
            {
                JSONCONS_THROW(conv_error(conv_errc::not_vector));
            }
        }